

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O0

void __thiscall
DDoor::DDoor(DDoor *this,sector_t *sec,EVlDoor type,double speed,int delay,int lightTag,
            int topcountdown)

{
  bool bVar1;
  DSectorEffect *pDVar2;
  DPlat *this_00;
  double dVar3;
  double dVar4;
  double height;
  vertex_t *spot;
  int local_30;
  int topcountdown_local;
  int lightTag_local;
  int delay_local;
  double speed_local;
  sector_t *psStack_18;
  EVlDoor type_local;
  sector_t *sec_local;
  DDoor *this_local;
  
  spot._4_4_ = topcountdown;
  local_30 = lightTag;
  topcountdown_local = delay;
  _lightTag_local = speed;
  speed_local._4_4_ = type;
  psStack_18 = sec;
  sec_local = (sector_t *)this;
  DMovingCeiling::DMovingCeiling(&this->super_DMovingCeiling,sec,true);
  (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_00b6c970;
  this->m_Type = speed_local._4_4_;
  this->m_Speed = _lightTag_local;
  this->m_TopWait = topcountdown_local;
  this->m_TopCountdown = spot._4_4_;
  this->m_LightTag = local_30;
  if ((i_compatflags & 0x200U) != 0) {
    this->m_LightTag = 0;
  }
  switch(speed_local._4_4_) {
  case doorClose:
    this->m_Direction = -1;
    dVar4 = sector_t::FindLowestCeilingSurrounding(psStack_18,(vertex_t **)&height);
    dVar4 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)height,dVar4 + -4.0);
    this->m_TopDist = dVar4;
    DoorSound(this,false,(DSeqNode *)0x0);
    break;
  case doorOpen:
  case doorRaise:
    this->m_Direction = 1;
    dVar4 = sector_t::FindLowestCeilingSurrounding(psStack_18,(vertex_t **)&height);
    dVar4 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)height,dVar4 + -4.0);
    this->m_TopDist = dVar4;
    dVar4 = this->m_TopDist;
    dVar3 = secplane_t::fD(&psStack_18->ceilingplane);
    if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
      DoorSound(this,true,(DSeqNode *)0x0);
    }
    break;
  case doorWaitRaise:
    this->m_Direction = 2;
    dVar4 = sector_t::FindLowestCeilingSurrounding(psStack_18,(vertex_t **)&height);
    dVar4 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)height,dVar4 + -4.0);
    this->m_TopDist = dVar4;
    break;
  case doorCloseWaitOpen:
    dVar4 = secplane_t::fD(&psStack_18->ceilingplane);
    this->m_TopDist = dVar4;
    this->m_Direction = -1;
    DoorSound(this,false,(DSeqNode *)0x0);
    break;
  case doorWaitClose:
    this->m_Direction = 0;
    this->m_Type = doorRaise;
    dVar4 = sector_t::FindHighestFloorPoint(psStack_18,&this->m_BotSpot);
    dVar4 = secplane_t::PointToDist(&psStack_18->ceilingplane,this->m_BotSpot,dVar4);
    this->m_BotDist = dVar4;
    dVar4 = secplane_t::fD(&psStack_18->floorplane);
    this->m_OldFloorDist = dVar4;
    dVar4 = secplane_t::fD(&psStack_18->ceilingplane);
    this->m_TopDist = dVar4;
  }
  pDVar2 = ::TObjPtr::operator_cast_to_DSectorEffect_
                     ((TObjPtr *)
                      &((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                       floordata);
  if (pDVar2 != (DSectorEffect *)0x0) {
    pDVar2 = TObjPtr<DSectorEffect>::operator->
                       (&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                         floordata);
    bVar1 = DObject::IsKindOf((DObject *)pDVar2,DPlat::RegistrationInfo.MyClass);
    if (bVar1) {
      this_00 = barrier_cast<DPlat*,DSectorEffect>
                          (&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)
                            ->floordata);
      bVar1 = DPlat::IsLift(this_00);
      if (bVar1) {
        dVar4 = sector_t::FindLowestCeilingPoint(psStack_18,&this->m_BotSpot);
        dVar4 = secplane_t::PointToDist(&psStack_18->ceilingplane,this->m_BotSpot,dVar4);
        this->m_BotDist = dVar4;
        goto LAB_00636ab5;
      }
    }
  }
  dVar4 = sector_t::FindHighestFloorPoint(psStack_18,&this->m_BotSpot);
  dVar4 = secplane_t::PointToDist(&psStack_18->ceilingplane,this->m_BotSpot,dVar4);
  this->m_BotDist = dVar4;
LAB_00636ab5:
  dVar4 = secplane_t::fD(&psStack_18->floorplane);
  this->m_OldFloorDist = dVar4;
  return;
}

Assistant:

DDoor::DDoor (sector_t *sec, EVlDoor type, double speed, int delay, int lightTag, int topcountdown)
	: DMovingCeiling (sec),
  	  m_Type (type), m_Speed (speed), m_TopWait (delay), m_TopCountdown(topcountdown), m_LightTag (lightTag)
{
	vertex_t *spot;
	double height;

	if (i_compatflags & COMPATF_NODOORLIGHT)
	{
		m_LightTag = 0;
	}

	switch (type)
	{
	case doorClose:
		m_Direction = -1;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		DoorSound (false);
		break;

	case doorOpen:
	case doorRaise:
		m_Direction = 1;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		if (m_TopDist != sec->ceilingplane.fD())
			DoorSound (true);
		break;

	case doorCloseWaitOpen:
		m_TopDist = sec->ceilingplane.fD();
		m_Direction = -1;
		DoorSound (false);
		break;

	case doorWaitRaise:
		m_Direction = 2;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		break;

	case doorWaitClose:
		m_Direction = 0;
		m_Type = DDoor::doorRaise;
		height = sec->FindHighestFloorPoint (&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
		m_OldFloorDist = sec->floorplane.fD();
		m_TopDist = sec->ceilingplane.fD();
		break;

	}

	if (!m_Sector->floordata || !m_Sector->floordata->IsKindOf(RUNTIME_CLASS(DPlat)) ||
		!(barrier_cast<DPlat*>(m_Sector->floordata))->IsLift())
	{
		height = sec->FindHighestFloorPoint (&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
	}
	else
	{
		height = sec->FindLowestCeilingPoint(&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
	}
	m_OldFloorDist = sec->floorplane.fD();
}